

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O0

void Qentem::Test::TestMathUTag1(QTest *test)

{
  Value<char16_t> *pVVar1;
  StringStream<char16_t> *pSVar2;
  undefined1 local_38 [8];
  Value<char16_t> value;
  StringStream<char16_t> ss;
  QTest *test_local;
  
  StringStream<char16_t>::StringStream((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::Value((Value<char16_t> *)local_38);
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a1");
  Value<char16_t>::operator=(pVVar1,5);
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a2");
  Value<char16_t>::operator=(pVVar1,true);
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a3");
  Value<char16_t>::operator=(pVVar1,(NullType)0x0);
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a4");
  Value<char16_t>::operator=(pVVar1,false);
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a5");
  Value<char16_t>::operator=(pVVar1,L"10");
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a6");
  Value<char16_t>::operator=(pVVar1,L"20");
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a7");
  Value<char16_t>::operator=(pVVar1,6);
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a8");
  Value<char16_t>::operator=(pVVar1,1);
  pVVar1 = Value<char16_t>::operator[]((Value<char16_t> *)local_38,L"a9");
  Value<char16_t>::operator=(pVVar1,L"1");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1+1}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x13c48c,0x6f9);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+8}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"13",0x6fc);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+8}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"14",0x6ff);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+{var:a1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x132a62,0x702);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a5}+{var:a1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x705);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a5}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x708);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}+{var:a5}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x137c8c,0x70b);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*{var:a2}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x132668,0x70e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*{var:a4}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x711);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*{var:a7}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"120",0x714);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+{var:a6}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"26",0x717);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a2}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x1326a2,0x71a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}=={var:a2}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x71d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}=={var:a8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x720);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a5}!={var:a1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x723);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}!={var:a4}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x726);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}==true}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x729);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a9}=={var:a8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x72c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}=={var:a9}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x72f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1=={var:a8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x732);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5==({var:a9})}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x735);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5==({var:a8})}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x738);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:null!={var:a3}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x73b);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:({var:a3})==(0)}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x73e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x132a62,0x741);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}{math:{var:a1}+{var:a7}}",
                      (Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"1111",0x745);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}*{math:{var:a1}+{var:a7}}",
                      (Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"11*11",0x749);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}##{math:{var:a1}+{var:a7}}",
                      (Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar2,(char16_t (*) [7])L"11##11",0x74d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a7}}&&&%%^^&&*{math:{var:a1}+{var:a7}}",
                      (Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[15]>
            (test,pSVar2,(char16_t (*) [15])L"11&&&%%^^&&*11",0x751);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:a1}+8}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"13",0x756);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  {var:a7}+8}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"14",0x759);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:     {var:a7}+{var:a1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x132a62,0x75c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a5} +{var:a1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x75f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}  +{var:a5}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x762);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}    +{var:a5}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x137c8c,0x765);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}* {var:a2}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x132668,0x768);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*  {var:a4}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x76b);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a6}*      {var:a7}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"120",0x76e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a7}+{var:a6} }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"26",0x771);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a1}+{var:a2}  }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x1326a2,0x774);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}=={var:a2}      }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x777);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a2}=={var:a8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x77a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:a5}!={var:a1} }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x77d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  {var:a2}!={var:a4}  }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x780);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:    1=={var:a9}     }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x783);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a9} == {var:a8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x786);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a8}  ==  {var:a9}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x789);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1==          {var:a8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x78c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5         ==1}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x78f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1          ==            {var:a8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x792);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:     0     !=    ({var:a3})        }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x795);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:a3}       ==       null     }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x798);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:((8+1+{var:a8}))}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x133d5c,0x79b);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:10==(8+1+{var:a8})}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x79e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:((8+1+{var:a8}))==9+1}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x7a1);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:(5*2)==((8+1+{var:a8}))}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x7a4);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::Reset((Value<char16_t> *)local_38);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,5);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,true);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,(NullType)0x0);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,false);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"10");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"20");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,6);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,1);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"1");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"Qentem");
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:0}+8}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"13",0x7b5);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:6}+8}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"14",0x7b8);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:6}+{var:0}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x132a62,0x7bb);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:4}+{var:0}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x7be);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:0}+{var:4}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"15",0x7c1);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}+{var:4}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x137c8c,0x7c4);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}*{var:1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x132668,0x7c7);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}*{var:3}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x7ca);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:5}*{var:6}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"120",0x7cd);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:6}+{var:5}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"26",2000);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:0}+{var:1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x1326a2,0x7d3);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:7}=={var:1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x7d6);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:1}=={var:7}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x7d9);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:4}!={var:0}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x7dc);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:1}!={var:3}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x7df);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:({var:1})==({var:8})}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x7e2);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"-{math:{var:8}=={var:7}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])0x133448,0x7e5);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"--{math:{var:7}=={var:8}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])0x133446,0x7e8);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"---{math:1=={var:7}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])L"---1",0x7eb);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:1==({var:8})}-",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar2,(char16_t (*) [3])L"1-",0x7ee);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:6-5==({var:7})}--",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"1--",0x7f1);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:0==({var:2})}---",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar2,(char16_t (*) [5])0x13359a,0x7f4);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"-{math:{var:2}!=null}-",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar2,(char16_t (*) [4])L"-0-",0x7f7);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"--{math:Qente=={var:9}}--",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar2,(char16_t (*) [6])L"--0--",0x7fa);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"---{math:Qente !={var:9}}---",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,pSVar2,(char16_t (*) [8])L"---1---",0x7fd);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  Qentem   =={var:9}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x800);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  Qentem!={var:9}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x803);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:9}   ==    Qente}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x806);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:{var:9} !=    Qente    }",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x809);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math:  {var:9}   ==Qentem}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x80c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:9} !=Qentem}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134e0a,0x80f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: true == {var:1}}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x814);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: {var:1} == true}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x134ea4,0x817);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar2 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{math: 8 /2}",(Value<char16_t> *)local_38,
                      (StringStream<char16_t> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar2,(char16_t (*) [2])0x1324fe,0x81a);
  Value<char16_t>::~Value((Value<char16_t> *)local_38);
  StringStream<char16_t>::~StringStream((StringStream<char16_t> *)&value.type_);
  return;
}

Assistant:

static void TestMathUTag1(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;

    value[uR"(a1)"] = 5;
    value[uR"(a2)"] = true;
    value[uR"(a3)"] = nullptr;
    value[uR"(a4)"] = false;
    value[uR"(a5)"] = uR"(10)";
    value[uR"(a6)"] = uR"(20)";
    value[uR"(a7)"] = 6;
    value[uR"(a8)"] = 1;
    value[uR"(a9)"] = uR"(1)";

    test.IsEqual(Template::Render(uR"({math:1+1})", value, ss), uR"(2)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a1}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5}+{var:a1}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a5}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}+{var:a5}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a2}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a4}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a7}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a6}})", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a2}})", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a2}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5}!={var:a1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}!={var:a4}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}==true})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a9}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:a9})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:a8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:null!={var:a3}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:({var:a3})==(0)})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}{math:{var:a1}+{var:a7}})", value, ss), uR"(1111)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}*{math:{var:a1}+{var:a7}})", value, ss), uR"(11*11)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}##{math:{var:a1}+{var:a7}})", value, ss), uR"(11##11)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}&&&%%^^&&*{math:{var:a1}+{var:a7}})", value, ss),
                 uR"(11&&&%%^^&&*11)", __LINE__);
    ss.Clear();

    ///////////////////

    test.IsEqual(Template::Render(uR"({math: {var:a1}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:a7}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:     {var:a7}+{var:a1}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5} +{var:a1}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}  +{var:a5}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}    +{var:a5}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}* {var:a2}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*  {var:a4}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*      {var:a7}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a6} })", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a2}  })", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a2}      })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:a5}!={var:a1} })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:a2}!={var:a4}  })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:    1=={var:a9}     })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a9} == {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}  ==  {var:a9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1==          {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5         ==1})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1          ==            {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:     0     !=    ({var:a3})        })", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a3}       ==       null     })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:((8+1+{var:a8}))})", value, ss), uR"(10)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:10==(8+1+{var:a8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:((8+1+{var:a8}))==9+1})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:(5*2)==((8+1+{var:a8}))})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    //////////////
    value.Reset();

    value += 5;
    value += true;
    value += nullptr;
    value += false;
    value += uR"(10)";
    value += uR"(20)";
    value += 6;
    value += 1;
    value += uR"(1)";
    value += uR"(Qentem)";

    test.IsEqual(Template::Render(uR"({math:{var:0}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+{var:0}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:4}+{var:0}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:0}+{var:4}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}+{var:4}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:1}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:3}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:6}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+{var:5}})", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:0}+{var:1}})", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:7}=={var:1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:1}=={var:7}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:4}!={var:0}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:1}!={var:3}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:({var:1})==({var:8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(-{math:{var:8}=={var:7}})", value, ss), uR"(-1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(--{math:{var:7}=={var:8}})", value, ss), uR"(--1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(---{math:1=={var:7}})", value, ss), uR"(---1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1==({var:8})}-)", value, ss), uR"(1-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:7})}--)", value, ss), uR"(1--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:0==({var:2})}---)", value, ss), uR"(1---)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(-{math:{var:2}!=null}-)", value, ss), uR"(-0-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(--{math:Qente=={var:9}}--)", value, ss), uR"(--0--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(---{math:Qente !={var:9}}---)", value, ss), uR"(---1---)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  Qentem   =={var:9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  Qentem!={var:9}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:9}   ==    Qente})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:9} !=    Qente    })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:9}   ==Qentem})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:9} !=Qentem})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    /////////

    test.IsEqual(Template::Render(uR"({math: true == {var:1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:1} == true})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: 8 /2})", value, ss), uR"(4)", __LINE__);
}